

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

const_reverse_iterator __thiscall qpdf::Array::crend(Array *this)

{
  undefined8 __p;
  QPDF_Array *pQVar1;
  element_type *peVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar3;
  Array *in_RSI;
  undefined1 local_38 [32];
  
  pQVar1 = BaseHandle::as<QPDF_Array>(&in_RSI->super_BaseHandle);
  if (pQVar1 == (QPDF_Array *)0x0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    if ((pQVar1->sp)._M_t.
        super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
        super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
        super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0) {
      pvVar3 = &pQVar1->elements;
    }
    else {
      pvVar3 = (in_RSI->sp_elements)._M_t.
               super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
               .
               super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
               ._M_head_impl;
      if (pvVar3 == (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0) {
        getAsVector((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_38 + 8),
                    in_RSI);
        std::
        make_unique<std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_38);
        __p = local_38._0_8_;
        local_38._0_8_ =
             (__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
              )0x0;
        std::
        __uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::reset((__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 *)&in_RSI->sp_elements,(pointer)__p);
        std::
        unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
        ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                       *)local_38);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_38 + 8));
        pvVar3 = (in_RSI->sp_elements)._M_t.
                 super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                 ._M_head_impl;
      }
    }
    peVar2 = *(element_type **)
              &(pvVar3->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
               _M_impl.super__Vector_impl_data;
  }
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  return (const_reverse_iterator)
         (__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          )this;
}

Assistant:

Array::const_reverse_iterator
Array::crend()
{
    if (auto a = as<QPDF_Array>()) {
        if (!a->sp) {
            return a->elements.crend();
        }
        if (!sp_elements) {
            sp_elements = std::make_unique<std::vector<QPDFObjectHandle>>(getAsVector());
        }
        return sp_elements->crend();
    }
    return {};
}